

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

void __thiscall spdlog::details::file_helper::flush(file_helper *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  string *in_stack_ffffffffffffffb0;
  filename_t local_48 [2];
  
  iVar1 = fflush((FILE *)in_RDI->_M_string_length);
  if (iVar1 != 0) {
    details::os::filename_to_str(local_48);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI);
    __errno_location();
    throw_spdlog_ex(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  return;
}

Assistant:

SPDLOG_INLINE void file_helper::flush() {
    if (std::fflush(fd_) != 0) {
        throw_spdlog_ex("Failed flush to file " + os::filename_to_str(filename_), errno);
    }
}